

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

char * Diligent::GetDeviceFeatureStateString(DEVICE_FEATURE_STATE State,bool bGetFullName)

{
  Char *Message;
  char (*in_R8) [2];
  uint local_3c;
  undefined1 local_38 [8];
  string msg;
  bool bGetFullName_local;
  char *pcStack_10;
  DEVICE_FEATURE_STATE State_local;
  
  if (State == DEVICE_FEATURE_STATE_DISABLED) {
    pcStack_10 = "Disabled";
    if (bGetFullName) {
      pcStack_10 = "DEVICE_FEATURE_STATE_DISABLED";
    }
  }
  else if (State == DEVICE_FEATURE_STATE_ENABLED) {
    pcStack_10 = "Enabled";
    if (bGetFullName) {
      pcStack_10 = "DEVICE_FEATURE_STATE_ENABLED";
    }
  }
  else if (State == DEVICE_FEATURE_STATE_OPTIONAL) {
    pcStack_10 = "Optional";
    if (bGetFullName) {
      pcStack_10 = "DEVICE_FEATURE_STATE_OPTIONAL";
    }
  }
  else {
    local_3c = (uint)State;
    msg.field_2._M_local_buf[0xe] = bGetFullName;
    msg.field_2._M_local_buf[0xf] = State;
    FormatString<char[34],unsigned_int,char[2]>
              ((string *)local_38,(Diligent *)"Unexpected device feature state (",
               (char (*) [34])&local_3c,(uint *)0xcabce5,in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetDeviceFeatureStateString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x622);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const char* GetDeviceFeatureStateString(DEVICE_FEATURE_STATE State, bool bGetFullName)
{
    switch (State)
    {
        // clang-format off
        case DEVICE_FEATURE_STATE_DISABLED: return bGetFullName ? "DEVICE_FEATURE_STATE_DISABLED" : "Disabled";
        case DEVICE_FEATURE_STATE_OPTIONAL: return bGetFullName ? "DEVICE_FEATURE_STATE_OPTIONAL" : "Optional";
        case DEVICE_FEATURE_STATE_ENABLED:  return bGetFullName ? "DEVICE_FEATURE_STATE_ENABLED"  : "Enabled";
        // clang-format on
        default:
            UNEXPECTED("Unexpected device feature state (", Uint32{State}, ")");
            return "UNKNOWN";
    }
}